

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O1

void lj_str_resize(lua_State *L,MSize newmask)

{
  uint uVar1;
  uint uVar2;
  void *__s;
  ulong uVar3;
  uint *puVar4;
  long lVar5;
  long *plVar6;
  bool bVar7;
  
  if ((newmask < 0x3ffffff) &&
     (plVar6 = (long *)(ulong)(L->glref).ptr32, *(char *)((long)plVar6 + 0x29) != '\x03')) {
    uVar1 = newmask * 4 + 4;
    __s = lj_mem_realloc(L,(void *)0x0,0,uVar1);
    memset(__s,0,(ulong)uVar1);
    uVar3 = (ulong)*(uint *)(plVar6 + 1);
    if (uVar3 != 0xffffffff) {
      do {
        uVar1 = *(uint *)(*plVar6 + uVar3 * 4);
        while (uVar1 != 0) {
          puVar4 = (uint *)(ulong)uVar1;
          uVar2 = *puVar4;
          *puVar4 = *(uint *)((long)__s + (ulong)(puVar4[2] & newmask) * 4);
          *(uint *)((long)__s + (ulong)(puVar4[2] & newmask) * 4) = uVar1;
          uVar1 = uVar2;
        }
        bVar7 = uVar3 != 0;
        uVar3 = uVar3 - 1;
      } while (bVar7);
    }
    lVar5 = (ulong)((int)plVar6[1] + 1) << 2;
    *(int *)(plVar6 + 4) = (int)plVar6[4] - (int)lVar5;
    (*(code *)plVar6[2])(plVar6[3],*plVar6,lVar5,0);
    *(MSize *)(plVar6 + 1) = newmask;
    *plVar6 = (long)__s;
  }
  return;
}

Assistant:

void lj_str_resize(lua_State *L, MSize newmask)
{
  global_State *g = G(L);
  GCRef *newhash;
  MSize i;
  if (g->gc.state == GCSsweepstring || newmask >= LJ_MAX_STRTAB-1)
    return;  /* No resizing during GC traversal or if already too big. */
  newhash = lj_mem_newvec(L, newmask+1, GCRef);
  memset(newhash, 0, (newmask+1)*sizeof(GCRef));
  for (i = g->strmask; i != ~(MSize)0; i--) {  /* Rehash old table. */
    GCobj *p = gcref(g->strhash[i]);
    while (p) {  /* Follow each hash chain and reinsert all strings. */
      MSize h = gco2str(p)->hash & newmask;
      GCobj *next = gcnext(p);
      /* NOBARRIER: The string table is a GC root. */
      setgcrefr(p->gch.nextgc, newhash[h]);
      setgcref(newhash[h], p);
      p = next;
    }
  }
  lj_mem_freevec(g, g->strhash, g->strmask+1, GCRef);
  g->strmask = newmask;
  g->strhash = newhash;
}